

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl_mus_player.cpp
# Opt level: O2

bool __thiscall OPLmusicBlock::ServiceStream(OPLmusicBlock *this,void *buff,int numbytes)

{
  ulong *puVar1;
  OPLio *pOVar2;
  OPLEmul *pOVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int count;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  double dVar13;
  
  bVar5 = ((this->super_musicBlock).io)->IsOPL3 | this->FullPan;
  memset(buff,0,(long)numbytes);
  FCriticalSection::Enter(&this->ChipAccess);
  uVar9 = (ulong)(long)numbytes >> (bVar5 + 2 & 0x3f);
  bVar4 = false;
LAB_003542d7:
  do {
    do {
      iVar10 = (int)uVar9;
      uVar11 = uVar9 & 0xffffffff;
      if (iVar10 < 1) {
LAB_00354466:
        FCriticalSection::Leave(&this->ChipAccess);
        return iVar10 < 1;
      }
      dVar13 = this->NextTickIn;
      uVar6 = (uint)dVar13;
      uVar8 = (ulong)uVar6;
      if (iVar10 < (int)uVar6) {
        uVar8 = uVar9 & 0xffffffff;
      }
      if (0 < (int)uVar6) {
        uVar9 = 0;
        while( true ) {
          pOVar2 = (this->super_musicBlock).io;
          iVar7 = (int)uVar8;
          if (pOVar2->NumChips <= uVar9) break;
          pOVar3 = pOVar2->chips[uVar9];
          (*pOVar3->_vptr_OPLEmul[4])(pOVar3,buff,uVar8);
          uVar9 = uVar9 + 1;
        }
        count = iVar7 << (bVar5 & 0x1f);
        OffsetSamples(this,(float *)buff,count);
        if (dVar13 != this->NextTickIn) {
          __assert_fail("NextTickIn == ticky",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/oplsynth/opl_mus_player.cpp"
                        ,0xf4,"bool OPLmusicBlock::ServiceStream(void *, int)");
        }
        dVar13 = this->NextTickIn - (double)iVar7;
        this->NextTickIn = dVar13;
        if (dVar13 < 0.0) {
          __assert_fail("NextTickIn >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/oplsynth/opl_mus_player.cpp"
                        ,0xf6,"bool OPLmusicBlock::ServiceStream(void *, int)");
        }
        uVar11 = (ulong)(uint)(iVar10 - iVar7);
        buff = (void *)((long)buff + (long)count * 4);
      }
      uVar9 = uVar11;
    } while (1.0 <= dVar13);
    uVar6 = (*this->_vptr_OPLmusicBlock[3])(this);
    bVar12 = uVar6 == 0;
    if ((int)uVar6 < 0) {
      __assert_fail("next >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/oplsynth/opl_mus_player.cpp"
                    ,0xfe,"bool OPLmusicBlock::ServiceStream(void *, int)");
    }
    if (!bVar12) {
      pOVar2 = (this->super_musicBlock).io;
      (*pOVar2->_vptr_OPLio[6])(pOVar2,(ulong)uVar6);
      dVar13 = (double)(int)uVar6 * this->SamplesPerTick + this->NextTickIn;
      this->NextTickIn = dVar13;
      if (dVar13 < 0.0) {
        __assert_fail("NextTickIn >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/oplsynth/opl_mus_player.cpp"
                      ,0x11a,"bool OPLmusicBlock::ServiceStream(void *, int)");
      }
      puVar1 = &(this->super_musicBlock).MLtime;
      *puVar1 = *puVar1 + (ulong)uVar6;
      bVar4 = bVar12;
      goto LAB_003542d7;
    }
    if (bVar4 || (~this->Looping & 1U) != 0) {
      if (0 < (int)uVar11) {
        for (uVar9 = 0; pOVar2 = (this->super_musicBlock).io, uVar9 < pOVar2->NumChips;
            uVar9 = uVar9 + 1) {
          pOVar3 = pOVar2->chips[uVar9];
          (*pOVar3->_vptr_OPLEmul[4])(pOVar3,buff,uVar11);
        }
        OffsetSamples(this,(float *)buff,(int)uVar11 << (bVar5 & 0x1f));
      }
      goto LAB_00354466;
    }
    (*this->_vptr_OPLmusicBlock[2])(this);
    bVar4 = bVar12;
  } while( true );
}

Assistant:

bool OPLmusicBlock::ServiceStream (void *buff, int numbytes)
{
	float *samples1 = (float *)buff;
	int stereoshift = (int)(FullPan | io->IsOPL3);
	int numsamples = numbytes / (sizeof(float) << stereoshift);
	bool prevEnded = false;
	bool res = true;

	memset(buff, 0, numbytes);

	ChipAccess.Enter();
	while (numsamples > 0)
	{
		double ticky = NextTickIn;
		int tick_in = int(NextTickIn);
		int samplesleft = MIN(numsamples, tick_in);
		size_t i;

		if (samplesleft > 0)
		{
			for (i = 0; i < io->NumChips; ++i)
			{
				io->chips[i]->Update(samples1, samplesleft);
			}
			OffsetSamples(samples1, samplesleft << stereoshift);
			assert(NextTickIn == ticky);
			NextTickIn -= samplesleft;
			assert (NextTickIn >= 0);
			numsamples -= samplesleft;
			samples1 += samplesleft << stereoshift;
		}
		
		if (NextTickIn < 1)
		{
			int next = PlayTick();
			assert(next >= 0);
			if (next == 0)
			{ // end of song
				if (!Looping || prevEnded)
				{
					if (numsamples > 0)
					{
						for (i = 0; i < io->NumChips; ++i)
						{
							io->chips[i]->Update(samples1, numsamples);
						}
						OffsetSamples(samples1, numsamples << stereoshift);
					}
					res = false;
					break;
				}
				else
				{
					// Avoid infinite loops from songs that do nothing but end
					prevEnded = true;
					Restart ();
				}
			}
			else
			{
				prevEnded = false;
				io->WriteDelay(next);
				NextTickIn += SamplesPerTick * next;
				assert (NextTickIn >= 0);
				MLtime += next;
			}
		}
	}
	ChipAccess.Leave();
	return res;
}